

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_ManAddVisited(Dtt_Man_t *p,uint Truth2,int n)

{
  uint Entry;
  uint local_24;
  uint Class;
  uint Truth;
  int n_local;
  uint Truth2_local;
  Dtt_Man_t *p_local;
  
  local_24 = Truth2;
  if ((Truth2 & p->CmpMask) != 0) {
    local_24 = Truth2 ^ 0xffffffff;
  }
  Entry = p->pTable[local_24 & p->FunMask];
  if ((uint)p->nClasses <= Entry) {
    __assert_fail("Class < (unsigned)p->nClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                  ,0x17a,"void Dtt_ManAddVisited(Dtt_Man_t *, unsigned int, int)");
  }
  if (n <= p->pNodes[Entry]) {
    if (p->pNodes[Entry] != n) {
      __assert_fail("p->pNodes[Class] == n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0x17d,"void Dtt_ManAddVisited(Dtt_Man_t *, unsigned int, int)");
    }
    if (p->pVisited[Entry] == '\0') {
      p->pVisited[Entry] = '\x01';
      Vec_IntPush(p->vVisited,Entry);
    }
  }
  return;
}

Assistant:

void Dtt_ManAddVisited( Dtt_Man_t * p, unsigned Truth2, int n )
{
    unsigned Truth = Truth2 & p->CmpMask ? ~Truth2 : Truth2;
    unsigned Class = p->pTable[Truth & p->FunMask];
    assert( Class < (unsigned)p->nClasses );
    if ( p->pNodes[Class] < n )
        return;
    assert( p->pNodes[Class] == n );
    if ( p->pVisited[Class] )
        return;
    p->pVisited[Class] = 1;
    Vec_IntPush( p->vVisited, Class );
}